

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.h
# Opt level: O2

void __thiscall flatbuffers::BaseGenerator::~BaseGenerator(BaseGenerator *this)

{
  this->_vptr_BaseGenerator = (_func_int **)&PTR___cxa_pure_virtual_002f9748;
  std::__cxx11::string::~string((string *)&this->default_extension_);
  std::__cxx11::string::~string((string *)&this->qualifying_separator_);
  std::__cxx11::string::~string((string *)&this->qualifying_start_);
  return;
}

Assistant:

virtual ~BaseGenerator() {}